

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHelper.h
# Opt level: O0

bool __thiscall FIX::ExeceptionStore::set(ExeceptionStore *this,int param_1,string *param_2)

{
  IOException *this_00;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *param_2_local;
  ExeceptionStore *pEStack_10;
  int param_1_local;
  ExeceptionStore *this_local;
  
  local_20 = param_2;
  param_2_local._4_4_ = param_1;
  pEStack_10 = this;
  this_00 = (IOException *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"set threw an IOException",&local_41);
  IOException::IOException(this_00,&local_40);
  __cxa_throw(this_00,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

bool set( int, const std::string& ) EXCEPT ( IOException ) {
    throw IOException("set threw an IOException");
  }